

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_metric.hpp
# Opt level: O0

void Omega_h::average_metric_contrib<2>(Tensor<2> *am,Int *n,Tensor<2> m,bool has_degen)

{
  Tensor<2> m_00;
  Tensor<2> *pTVar1;
  double extraout_XMM0_Qa;
  double in_stack_fffffffffffffd78;
  double dVar2;
  bool has_degen_local;
  Int *n_local;
  Tensor<2> *am_local;
  double local_1f0;
  double local_1e8;
  double local_1e0;
  int local_1d8;
  int local_1d4;
  Int i;
  Int j;
  Real x;
  double local_1c0;
  int local_1b4;
  Tensor<2> **local_1b0;
  int local_1a4;
  Tensor<2> **local_1a0;
  double local_138;
  Matrix<2,_2> c;
  int local_a0;
  Int j_1;
  int local_6c;
  Int i_1;
  double local_58 [3];
  Vector<2> c_1;
  
  if (has_degen) {
    am_local = (Tensor<2> *)
               m.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[0];
    local_1f0 = m.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[1];
    local_1e8 = m.super_Few<Omega_h::Vector<2>,_2>.array_[1].super_Few<double,_2>.array_[0];
    local_1e0 = m.super_Few<Omega_h::Vector<2>,_2>.array_[1].super_Few<double,_2>.array_[1];
    _i = 0.0;
    pTVar1 = am;
    for (local_1d4 = 0; local_1d4 < 2; local_1d4 = local_1d4 + 1) {
      for (local_1d8 = 0; dVar2 = _i, local_1d8 < 2; local_1d8 = local_1d8 + 1) {
        local_1a0 = &am_local;
        local_1a4 = local_1d4;
        local_1b0 = local_1a0 + (long)local_1d4 * 2;
        local_1b4 = local_1d8;
        std::abs((int)pTVar1);
        local_1c0 = dVar2;
        if (dVar2 < extraout_XMM0_Qa) {
          dVar2 = extraout_XMM0_Qa;
        }
        in_stack_fffffffffffffd78 = dVar2;
        _i = dVar2;
      }
    }
    if (_i < 1e-10) {
      return;
    }
  }
  m_00.super_Few<Omega_h::Vector<2>,_2>.array_[1].super_Few<double,_2>.array_[1] =
       in_stack_fffffffffffffd78;
  m_00.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[0] =
       m.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[1];
  m_00.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[1] =
       m.super_Few<Omega_h::Vector<2>,_2>.array_[1].super_Few<double,_2>.array_[0];
  m_00.super_Few<Omega_h::Vector<2>,_2>.array_[1].super_Few<double,_2>.array_[0] =
       m.super_Few<Omega_h::Vector<2>,_2>.array_[1].super_Few<double,_2>.array_[1];
  linearize_metric<2>(m_00);
  for (local_a0 = 0; local_a0 < 2; local_a0 = local_a0 + 1) {
    for (local_6c = 0; local_6c < 2; local_6c = local_6c + 1) {
      (&c_1)[-1].super_Few<double,_2>.array_[(long)local_6c + 1] =
           local_58[local_6c] + *(double *)(&stack0xffffffffffffff98 + (long)local_6c * 8);
    }
    c.super_Few<Omega_h::Vector<2>,_2>.array_[(long)local_a0 + -1].super_Few<double,_2>.array_[1] =
         local_58[2];
    c.super_Few<Omega_h::Vector<2>,_2>.array_[local_a0].super_Few<double,_2>.array_[0] =
         c_1.super_Few<double,_2>.array_[0];
  }
  (am->super_Few<Omega_h::Vector<2>,_2>).array_[0].super_Few<double,_2>.array_[0] = local_138;
  (am->super_Few<Omega_h::Vector<2>,_2>).array_[0].super_Few<double,_2>.array_[1] =
       c.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[0];
  (am->super_Few<Omega_h::Vector<2>,_2>).array_[1].super_Few<double,_2>.array_[0] =
       c.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[1];
  (am->super_Few<Omega_h::Vector<2>,_2>).array_[1].super_Few<double,_2>.array_[1] =
       c.super_Few<Omega_h::Vector<2>,_2>.array_[1].super_Few<double,_2>.array_[0];
  *n = *n + 1;
  return;
}

Assistant:

OMEGA_H_INLINE_BIG void average_metric_contrib(
    Tensor<dim>& am, Int& n, Tensor<dim> const m, bool const has_degen) {
  if (has_degen && max_norm(m) < OMEGA_H_EPSILON) return;
  am += linearize_metric(m);
  n++;
}